

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O2

void __thiscall
iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_SplitBySingeChar_Test<char> *this)

{
  char *in_R9;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  re1_2;
  AssertionResult iutest_ar;
  basic_string_view<char,_std::char_traits<char>_> s1;
  basic_string_view<char,_std::char_traits<char>_> re1_1 [3];
  string local_268;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_248;
  undefined1 *local_230;
  undefined8 local_228;
  undefined1 local_220 [16];
  undefined1 local_210;
  iuCodeMessage local_208;
  basic_string_view<char,_std::char_traits<char>_> local_1d8;
  basic_string_view<char,_std::char_traits<char>_> local_1c8;
  undefined8 local_1b8;
  char *pcStack_1b0;
  undefined8 local_1a8;
  char *pcStack_1a0;
  Fixed local_198;
  
  local_1d8._M_len = 0x13;
  local_1d8._M_str = "arikitari na world!";
  local_1a8 = 6;
  pcStack_1a0 = "world!";
  local_1b8 = 2;
  pcStack_1b0 = "na";
  local_1c8._M_len = 9;
  local_1c8._M_str = "arikitari";
  local_198.super_Message.m_stream.super_iu_stringstream._0_1_ = 0x20;
  detail::operator|<std::basic_string_view<char,_std::char_traits<char>_>,_char,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_248,&local_1d8,(split_helper<char,_true,_false,_false> *)&local_198);
  local_210 = std::
              __equal4<std::basic_string_view<char,std::char_traits<char>>const*,__gnu_cxx::__normal_iterator<std::basic_string_view<char,std::char_traits<char>>const*,std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>>
                        (&local_1c8,(basic_string_view<char,_std::char_traits<char>_> *)&local_198,
                         (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          )local_248._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          )local_248._M_impl.super__Vector_impl_data._M_finish);
  local_230 = local_220;
  local_228 = 0;
  local_220[0] = 0;
  if (!(bool)local_210) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_268,(internal *)&local_230,
               (AssertionResult *)
               "std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end())","false",
               "true",in_R9);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x112,local_268._M_dataplus._M_p);
    local_208._44_4_ = 2;
    iutest::AssertionHelper::OnFixed((AssertionHelper *)&local_208,&local_198);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_268);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&local_230);
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_248);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, SplitBySingeChar)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s1 = constant::arikitari_na_world<char_type>();
	const std::basic_string_view<char_type> re1_1[] = { constant::arikitari<char_type>(), constant::na<char_type>(), constant::world<char_type>() };
	const auto re1_2 = s1 | split(constant::space<char_type>());
	IUTEST_ASSERT_TRUE(std::equal(std::begin(re1_1), std::end(re1_1), re1_2.begin(), re1_2.end()));
	if constexpr(!std::is_same_v<char_type, char>) {
		const std::basic_string_view<char_type> s2 = constant::arikitarina_sekai<char_type>();
		const std::basic_string_view<char_type> re2_1[] = { constant::arikitarina<char_type>(), constant::sekai<char_type>() };
		const auto re2_2 = s2 | split(constant::space<char_type>());
		IUTEST_ASSERT_TRUE(std::equal(std::begin(re2_1), std::end(re2_1), re2_2.begin(), re2_2.end()));
	}
}